

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt64x2Operation.cpp
# Opt level: O0

void Js::SIMDInt64x2Operation::OpReplaceLane(SIMDValue *dst,SIMDValue *src,int64 val,uint index)

{
  uint index_local;
  int64 val_local;
  SIMDValue *src_local;
  SIMDValue *dst_local;
  
  _SIMDValue::SetValue(dst,(_SIMDValue)src->field_0);
  (dst->field_0).i64[index] = val;
  return;
}

Assistant:

void SIMDInt64x2Operation::OpReplaceLane(SIMDValue* dst, SIMDValue* src, int64 val, uint index)
    {
        dst->SetValue(*src);
        dst->i64[index] = val;
    }